

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

void addOptions(parser *cmd)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *in_stack_fffffffffffffc80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc88;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  char short_name;
  string *in_stack_fffffffffffffca8;
  parser *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  undefined1 uVar2;
  string *in_stack_fffffffffffffcc8;
  string *desc;
  undefined8 in_stack_fffffffffffffcd0;
  char cVar3;
  string *in_stack_fffffffffffffcd8;
  string *name;
  parser *in_stack_fffffffffffffce0;
  parser *this_00;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [32];
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [39];
  undefined1 local_1e1 [40];
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  undefined1 local_121 [40];
  undefined1 local_f9 [40];
  undefined1 local_d1 [40];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  short_name = (char)((ulong)in_stack_fffffffffffffca0 >> 0x38);
  cVar3 = (char)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffcc0 >> 0x38);
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::string(local_88);
  cmdline::parser::add<std::__cxx11::string>
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,cVar3,in_stack_fffffffffffffcc8,
             (bool)uVar2,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  this_00 = (parser *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  cmdline::parser::add
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,short_name,
             in_stack_fffffffffffffc98);
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  name = (string *)local_f9;
  pbVar1 = local_8;
  std::allocator<char>::allocator();
  cVar3 = (char)((ulong)pbVar1 >> 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  desc = (string *)local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  cmdline::parser::add
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,short_name,
             in_stack_fffffffffffffc98);
  std::__cxx11::string::~string((string *)(local_121 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_121);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  uVar2 = (undefined1)((ulong)&local_149 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::string(local_198);
  cmdline::parser::add<std::__cxx11::string>(this_00,name,cVar3,desc,(bool)uVar2,local_8);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar1,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  this = local_208;
  std::__cxx11::string::string(this);
  cmdline::parser::add<std::__cxx11::string>(this_00,name,cVar3,desc,(bool)uVar2,local_8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)(local_1e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  __a = &local_229;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)this,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)this,__a);
  std::__cxx11::string::string(local_278);
  cmdline::parser::add<std::__cxx11::string>(this_00,name,cVar3,desc,(bool)uVar2,local_8);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)this,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)this,__a);
  std::__cxx11::string::string(local_2e8);
  cmdline::parser::add<std::__cxx11::string>(this_00,name,cVar3,desc,(bool)uVar2,local_8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  return;
}

Assistant:

void addOptions(cmdline::parser &cmd)
{
    cmd.add<std::string>("model", 'm',
                         "Model to load.",
                         true);

    cmd.add("print", 'p',
            "Print the model.");

    cmd.add("total-mass", '\0',
            "Get the total mass of a model.");

    cmd.add<std::string>("link-com", '\0',
                         "Print inertial information of a given link",false);

    cmd.add<std::string>("link-com-frame", '\0',
                         "If link-com is passed, link-com-frame specifies the frame in which the inertia information is printed (assuming that the model is in zero position)",false);

    cmd.add<std::string>("frame-pose", '\0',
                         "Print the referenceFrame_H_frame transform.",false);

    cmd.add<std::string>("frame-pose-reference-frame", '\0',
                         "If frame-pose is passed, frame-pose-reference-frame specifies the reference frame in which the frame pose is expressed (assuming that the model is in zero position)",false);
}